

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O1

void ScaleRowDown34_0_Box_C(uint8_t *src_ptr,ptrdiff_t src_stride,uint8_t *d,int dst_width)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  long lVar7;
  uint8_t *s;
  byte *pbVar8;
  
  if (0 < dst_width) {
    pbVar8 = src_ptr + 3;
    lVar7 = 0;
    do {
      bVar1 = pbVar8[-2];
      bVar2 = pbVar8[-1];
      bVar3 = *pbVar8;
      bVar4 = pbVar8[src_stride + -2];
      bVar5 = pbVar8[src_stride + -1];
      bVar6 = pbVar8[src_stride];
      d[lVar7] = (uint8_t)(((uint)bVar1 + (uint)pbVar8[-3] + (uint)pbVar8[-3] * 2 + 2 >> 2 & 0xff) *
                           3 + ((uint)bVar4 +
                                (uint)pbVar8[src_stride + -3] + (uint)pbVar8[src_stride + -3] * 2 +
                                2 >> 2 & 0xff) + 2 >> 2);
      d[lVar7 + 1] = (uint8_t)(((uint)bVar1 + (uint)bVar2 + 1 >> 1 & 0xff) * 3 +
                               ((uint)bVar4 + (uint)bVar5 + 1 >> 1 & 0xff) + 2 >> 2);
      d[lVar7 + 2] = (uint8_t)(((uint)bVar2 + (uint)bVar3 + (uint)bVar3 * 2 + 2 >> 2 & 0xff) * 3 +
                               ((uint)bVar5 + (uint)bVar6 + (uint)bVar6 * 2 + 2 >> 2 & 0xff) + 2 >>
                              2);
      lVar7 = lVar7 + 3;
      pbVar8 = pbVar8 + 4;
    } while ((int)lVar7 < dst_width);
  }
  return;
}

Assistant:

void ScaleRowDown34_0_Box_C(const uint8_t* src_ptr,
                            ptrdiff_t src_stride,
                            uint8_t* d,
                            int dst_width) {
  const uint8_t* s = src_ptr;
  const uint8_t* t = src_ptr + src_stride;
  int x;
  assert((dst_width % 3 == 0) && (dst_width > 0));
  for (x = 0; x < dst_width; x += 3) {
    uint8_t a0 = (s[0] * 3 + s[1] * 1 + 2) >> 2;
    uint8_t a1 = (s[1] * 1 + s[2] * 1 + 1) >> 1;
    uint8_t a2 = (s[2] * 1 + s[3] * 3 + 2) >> 2;
    uint8_t b0 = (t[0] * 3 + t[1] * 1 + 2) >> 2;
    uint8_t b1 = (t[1] * 1 + t[2] * 1 + 1) >> 1;
    uint8_t b2 = (t[2] * 1 + t[3] * 3 + 2) >> 2;
    d[0] = (a0 * 3 + b0 + 2) >> 2;
    d[1] = (a1 * 3 + b1 + 2) >> 2;
    d[2] = (a2 * 3 + b2 + 2) >> 2;
    d += 3;
    s += 4;
    t += 4;
  }
}